

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

void __thiscall
avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::processImplicitActions
          (SimpleParser<avro::parsing::ResolvingDecoderHandler> *this)

{
  bool bVar1;
  reference this_00;
  Symbol *s;
  Symbol *in_stack_00000020;
  ResolvingDecoderHandler *in_stack_00000028;
  
  while( true ) {
    this_00 = std::
              stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
              ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                     *)0x2188bf);
    bVar1 = Symbol::isImplicitAction(this_00);
    if (!bVar1) break;
    ResolvingDecoderHandler::handle(in_stack_00000028,in_stack_00000020);
    std::
    stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
    ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
           *)0x2188f3);
  }
  return;
}

Assistant:

void processImplicitActions() {
        for (; ;) {
            Symbol& s = parsingStack.top();
            if (s.isImplicitAction()) {
                handler_.handle(s);
                parsingStack.pop();
            } else {
                break;
            }
        }
    }